

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::stencil_func_separate(NegativeTestContext *ctx)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_ENUM is generated if face is not GL_FRONT, GL_BACK, or GL_FRONT_AND_BACK.",
             &local_29);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glStencilFuncSeparate(&ctx->super_CallLogWrapper,0xffffffff,0x200,0,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "GL_INVALID_ENUM is generated if func is not one of the eight accepted values.",
             &local_29);
  NegativeTestContext::beginSection(ctx,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  glu::CallLogWrapper::glStencilFuncSeparate(&ctx->super_CallLogWrapper,0x404,0xffffffff,0,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void stencil_func_separate (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if face is not GL_FRONT, GL_BACK, or GL_FRONT_AND_BACK.");
	ctx.glStencilFuncSeparate(-1, GL_NEVER, 0, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if func is not one of the eight accepted values.");
	ctx.glStencilFuncSeparate(GL_FRONT, -1, 0, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}